

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O0

void from_suite::convert_null(void)

{
  bool v;
  any *u;
  undefined1 local_48 [8];
  variable result;
  any local_10;
  any any;
  
  boost::any::any(&local_10);
  trial::dynamic::convert::into<trial::dynamic::basic_variable<std::allocator<char>>,boost::any>
            ((basic_variable<std::allocator<char>_> *)local_48,(convert *)&local_10,u);
  v = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x19,"void from_suite::convert_null()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  boost::any::~any(&local_10);
  return;
}

Assistant:

void convert_null()
{
    boost::any any;
    variable result = convert::into<variable>(any);
    TRIAL_PROTOCOL_TEST(result.is<nullable>());
}